

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_14x14(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 tmp16;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp6;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_164;
  int *local_158;
  int *local_150;
  int local_148 [8];
  int local_128 [8];
  int local_108 [8];
  int local_e8 [8];
  int local_c8 [8];
  int local_a8 [8];
  long local_88;
  long lStack_80;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_164 = 0;
  local_150 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(local_10 + (long)local_164 * 8) + (ulong)local_14);
      wsptr = (DCTELEM *)(long)(int)((uint)pbVar1[3] + (uint)pbVar1[10]);
      local_58 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[0xd]) +
                 (long)(int)((uint)pbVar1[6] + (uint)pbVar1[7]);
      elemptr = (JSAMPROW)
                ((long)(int)((uint)*pbVar1 + (uint)pbVar1[0xd]) -
                (long)(int)((uint)pbVar1[6] + (uint)pbVar1[7]));
      local_60 = (long)(int)((uint)pbVar1[1] + (uint)pbVar1[0xc]) +
                 (long)(int)((uint)pbVar1[5] + (uint)pbVar1[8]);
      lStack_80 = (long)(int)((uint)pbVar1[1] + (uint)pbVar1[0xc]) -
                  (long)(int)((uint)pbVar1[5] + (uint)pbVar1[8]);
      dataptr = (DCTELEM *)
                ((long)(int)((uint)pbVar1[2] + (uint)pbVar1[0xb]) +
                (long)(int)((uint)pbVar1[4] + (uint)pbVar1[9]));
      local_88 = (long)(int)((uint)pbVar1[2] + (uint)pbVar1[0xb]) -
                 (long)(int)((uint)pbVar1[4] + (uint)pbVar1[9]);
      local_20 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[0xd]);
      local_28 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[0xc]);
      local_30 = (long)(int)((uint)pbVar1[2] - (uint)pbVar1[0xb]);
      local_38 = (long)(int)((uint)pbVar1[3] - (uint)pbVar1[10]);
      local_40 = (long)(int)((uint)pbVar1[4] - (uint)pbVar1[9]);
      local_48 = (long)(int)((uint)pbVar1[5] - (uint)pbVar1[8]);
      local_50 = (long)(int)((uint)pbVar1[6] - (uint)pbVar1[7]);
      *local_150 = (int)local_58 + (int)local_60 + (int)dataptr + (uint)pbVar1[3] + (uint)pbVar1[10]
                   + -0x700;
      local_150[4] = (int)(local_58 * 0x28c6 + (long)wsptr * -0x2d42 + local_60 * 0xa12 +
                           (long)dataptr * -0x1c37 + 0x1000 >> 0xd);
      local_58 = (long)(elemptr + lStack_80) * 0x2362;
      local_150[2] = (int)(local_58 + (long)elemptr * 0x8bd + local_88 * 0x13a3 + 0x1000 >> 0xd);
      local_150[6] = (int)(local_58 + lStack_80 * -0x3704 + local_88 * -0x2c1f + 0x1000 >> 0xd);
      local_58 = local_28 + local_30;
      local_60 = local_48 - local_40;
      local_150[7] = ((((int)local_20 - (int)local_58) + (int)local_38) - (int)local_60) -
                     (int)local_50;
      local_58 = local_60 * 0x2cf8 + local_38 * -0x2000 + local_58 * -0x511;
      local_60 = (local_20 + local_30) * 0x2652 + (local_40 + local_50) * 0x1814;
      local_38 = local_38 * 0x2000;
      local_150[5] = (int)(local_58 + local_60 + local_30 * -0x4bf7 + local_40 * 0x23d7 + 0x1000 >>
                          0xd);
      dataptr = (DCTELEM *)((local_20 + local_28) * 0x2ab7 + (local_48 - local_50) * 0xef2);
      local_150[3] = (int)((long)dataptr +
                           local_48 * -0x623c + local_28 * -0xd92 + local_58 + 0x1000 >> 0xd);
      local_150[1] = (int)((long)dataptr +
                           local_20 * -0x2410 + local_50 * -0x240f + local_38 + local_60 + 0x1000 >>
                          0xd);
      local_164 = local_164 + 1;
      if (local_164 != 8) break;
      local_150 = local_148;
    }
    if (local_164 == 0xe) break;
    local_150 = local_150 + 8;
  }
  local_150 = local_8;
  local_158 = local_148;
  for (local_164 = 7; -1 < local_164; local_164 = local_164 + -1) {
    lVar2 = (long)(local_150[0x18] + local_158[0x10]);
    lVar3 = (long)(*local_150 + local_158[0x28]) + (long)(local_150[0x30] + local_150[0x38]);
    lVar4 = (long)(*local_150 + local_158[0x28]) - (long)(local_150[0x30] + local_150[0x38]);
    lVar5 = (long)(local_150[8] + local_158[0x20]) + (long)(local_150[0x28] + *local_158);
    lVar6 = (long)(local_150[8] + local_158[0x20]) - (long)(local_150[0x28] + *local_158);
    lVar7 = (long)(local_150[0x10] + local_158[0x18]) + (long)(local_150[0x20] + local_158[8]);
    lVar8 = (long)(local_150[0x10] + local_158[0x18]) - (long)(local_150[0x20] + local_158[8]);
    lVar9 = (long)(*local_150 - local_158[0x28]);
    lVar10 = (long)(local_150[8] - local_158[0x20]);
    lVar11 = (long)(local_150[0x10] - local_158[0x18]);
    lVar12 = (long)(local_150[0x18] - local_158[0x10]);
    lVar13 = (long)(local_150[0x20] - local_158[8]);
    lVar14 = (long)(local_150[0x28] - *local_158);
    lVar15 = (long)(local_150[0x30] - local_150[0x38]);
    *local_150 = (int)((lVar3 + lVar5 + lVar7 + lVar2) * 0x14e6 + 0x2000 >> 0xe);
    local_150[0x20] =
         (int)((lVar3 + lVar2 * -2) * 0x1aa1 + (lVar5 + lVar2 * -2) * 0x694 +
               (lVar7 + lVar2 * -2) * -0x126d + 0x2000 >> 0xe);
    lVar2 = (lVar4 + lVar6) * 0x171b;
    local_150[0x10] = (int)(lVar2 + lVar4 * 0x5b5 + lVar8 * 0xcd3 + 0x2000 >> 0xe);
    local_150[0x30] = (int)(lVar2 + lVar6 * -0x23ee + lVar8 * -0x1cd0 + 0x2000 >> 0xe);
    local_150[0x38] =
         (int)(((((lVar9 - (lVar10 + lVar11)) + lVar12) - (lVar14 - lVar13)) - lVar15) * 0x14e6 +
               0x2000 >> 0xe);
    lVar2 = (lVar14 - lVar13) * 0x1d5e + lVar12 * -0x14e6 + (lVar10 + lVar11) * -0x34f;
    lVar3 = (lVar9 + lVar11) * 0x1906 + (lVar13 + lVar15) * 0xfb9;
    local_150[0x28] = (int)(lVar2 + lVar3 + lVar11 * -0x319c + lVar13 * 0x1768 + 0x2000 >> 0xe);
    lVar4 = (lVar9 + lVar10) * 0x1be5 + (lVar14 - lVar15) * 0x9c3;
    local_150[0x18] = (int)(lVar2 + lVar4 + lVar10 * -0x8dd + lVar14 * -0x4027 + 0x2000 >> 0xe);
    local_150[8] = (int)(lVar3 + lVar4 + lVar12 * 0x14e6 + lVar9 * -0x178d + lVar15 * -0x2a7 +
                         0x2000 >> 0xe);
    local_150 = local_150 + 1;
    local_158 = local_158 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_14x14 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  DCTELEM workspace[8*6];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/28). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[11]);
    tmp13 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[7]);

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[11]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp10 + tmp11 + tmp12 + tmp13 - 14 * CENTERJSAMPLE);
    tmp13 += tmp13;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.274162392)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.314692123)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.881747734)),  /* c8 */
	      CONST_BITS);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(1.105676686));    /* c6 */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.273079590))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.613604268)),        /* c10 */
	      CONST_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.719280954))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(1.378756276)),        /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[7] = (DCTELEM) (tmp0 - tmp10 + tmp3 - tmp11 - tmp6);
    tmp3 <<= CONST_BITS;
    tmp10 = MULTIPLY(tmp10, - FIX(0.158341681));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(1.405321284));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(1.197448846)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.752406978));      /* c9 */
    dataptr[5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(2.373959773)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(1.119999435)),         /* c1+c11-c9 */
	      CONST_BITS);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(1.334852607)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.467085129));      /* c11 */
    dataptr[3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.424103948)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(3.069855259)),         /* c1+c5+c11 */
	      CONST_BITS);
    dataptr[1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3 + tmp6 -
	      MULTIPLY(tmp0 + tmp6, FIX(1.126980169)),    /* c3+c5-c1 */
	      CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 14)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/14)**2 = 16/49, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/28) * 32/49.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*3];
    tmp13 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] + dataptr[DCTSIZE*7];

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*3];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12 + tmp13,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp13 += tmp13;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(0.832106052)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.205513223)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.575835255)),  /* c8 */
	      CONST_BITS+1);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(0.722074570));    /* c6 */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.178337691))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.400721155)),        /* c10 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.122795725))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(0.900412262)),        /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[DCTSIZE*7] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp10 + tmp3 - tmp11 - tmp6,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp3  = MULTIPLY(tmp3 , FIX(0.653061224));            /* 32/49 */
    tmp10 = MULTIPLY(tmp10, - FIX(0.103406812));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(0.917760839));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(0.782007410)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.491367823));      /* c9 */
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(1.550341076)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(0.731428202)),         /* c1+c11-c9 */
	      CONST_BITS+1);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(0.871740478)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.305035186));      /* c11 */
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.276965844)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(2.004803435)),         /* c1+c5+c11 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3
	      - MULTIPLY(tmp0, FIX(0.735987049))          /* c3+c5-c1 */
	      - MULTIPLY(tmp6, FIX(0.082925825)),         /* c9-c11-c13 */
	      CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}